

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O3

uint64_t read_address(dwarf_buf *buf,int addrsize)

{
  byte *pbVar1;
  uint16_t uVar2;
  int iVar3;
  uint32_t uVar4;
  uint64_t uVar5;
  char local_e8 [8];
  char b [200];
  
  switch(addrsize) {
  case 1:
    pbVar1 = buf->buf;
    iVar3 = advance(buf,1);
    if (iVar3 == 0) {
      uVar5 = 0;
    }
    else {
      uVar5 = (uint64_t)*pbVar1;
    }
    break;
  case 2:
    uVar2 = read_uint16(buf);
    uVar5 = (uint64_t)uVar2;
    break;
  default:
    uVar5 = 0;
    snprintf(local_e8,200,"%s in %s at %d","unrecognized address size",buf->name,
             (ulong)(uint)(*(int *)&buf->buf - *(int *)&buf->start));
    (*buf->error_callback)(buf->data,local_e8,0);
    break;
  case 4:
    uVar4 = read_uint32(buf);
    uVar5 = (uint64_t)uVar4;
    break;
  case 8:
    uVar5 = read_uint64(buf);
    return uVar5;
  }
  return uVar5;
}

Assistant:

static uint64_t
read_address (struct dwarf_buf *buf, int addrsize)
{
  switch (addrsize)
    {
    case 1:
      return read_byte (buf);
    case 2:
      return read_uint16 (buf);
    case 4:
      return read_uint32 (buf);
    case 8:
      return read_uint64 (buf);
    default:
      dwarf_buf_error (buf, "unrecognized address size", 0);
      return 0;
    }
}